

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

Vec2 __thiscall
tcu::computeVulkanLodBoundsFromDerivates
          (tcu *this,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy,
          LodPrecision *prec)

{
  Vec2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float x;
  float y;
  float y_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float lodErr;
  float maxLod;
  float minLod;
  float pMaxErr;
  float pMinErr;
  float pMax;
  float pMin;
  float fyMax;
  float fxMax;
  float sqrt2;
  float fyMin;
  float fxMin;
  float mwy;
  float mvy;
  float muy;
  float mwx;
  float mvx;
  float mux;
  LodPrecision *prec_local;
  float dwdy_local;
  float dvdy_local;
  float dudy_local;
  float dwdx_local;
  float dvdx_local;
  float dudx_local;
  
  fVar2 = deFloatAbs(dudx);
  fVar3 = deFloatAbs(dvdx);
  fVar4 = deFloatAbs(dwdx);
  x = deFloatAbs(dudy);
  y = deFloatAbs(dvdy);
  y_00 = deFloatAbs(dwdy);
  fVar5 = de::max<float>(fVar2,fVar3);
  fVar5 = de::max<float>(fVar5,fVar4);
  fVar6 = de::max<float>(x,y);
  fVar6 = de::max<float>(fVar6,y_00);
  fVar7 = ::deFloatSqrt(2.0);
  fVar5 = de::max<float>(fVar5,fVar6);
  fVar2 = de::max<float>(fVar7 * (fVar2 + fVar3 + fVar4),fVar7 * (x + y + y_00));
  fVar3 = TexVerifierUtil::computeFloatingPointError(fVar5,prec->derivateBits);
  fVar4 = TexVerifierUtil::computeFloatingPointError(fVar2,prec->derivateBits);
  fVar3 = deFloatLog2(fVar5 - fVar3);
  fVar2 = deFloatLog2(fVar2 + fVar4);
  fVar4 = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  Vector<float,_2>::Vector((Vector<float,_2> *)this,fVar3 - fVar4,fVar2 + fVar4);
  VVar1.m_data[1] = extraout_XMM0_Db;
  VVar1.m_data[0] = extraout_XMM0_Da;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 computeVulkanLodBoundsFromDerivates (const float dudx, const float dvdx, const float dwdx, const float dudy, const float dvdy, const float dwdy, const LodPrecision& prec)
{
	const float		mux			= deFloatAbs(dudx);
	const float		mvx			= deFloatAbs(dvdx);
	const float		mwx			= deFloatAbs(dwdx);
	const float		muy			= deFloatAbs(dudy);
	const float		mvy			= deFloatAbs(dvdy);
	const float		mwy			= deFloatAbs(dwdy);

	// Ideal:
	// px = deFloatSqrt2(mux*mux + mvx*mvx + mwx*mwx);
	// py = deFloatSqrt2(muy*muy + mvy*mvy + mwy*mwy);

	// fx, fy estimate lower bounds
	const float		fxMin		= de::max(de::max(mux, mvx), mwx);
	const float		fyMin		= de::max(de::max(muy, mvy), mwy);

	// fx, fy estimate upper bounds
	const float		sqrt2		= deFloatSqrt(2.0f);
	const float		fxMax		= sqrt2 * (mux + mvx + mwx);
	const float		fyMax		= sqrt2 * (muy + mvy + mwy);

	// p = max(px, py) (isotropic filtering)
	const float		pMin		= de::max(fxMin, fyMin);
	const float		pMax		= de::max(fxMax, fyMax);

	// error terms
	const float		pMinErr		= computeFloatingPointError(pMin, prec.derivateBits);
	const float		pMaxErr		= computeFloatingPointError(pMax, prec.derivateBits);

	const float		minLod		= deFloatLog2(pMin-pMinErr);
	const float		maxLod		= deFloatLog2(pMax+pMaxErr);
	const float		lodErr		= computeFixedPointError(prec.lodBits);

	DE_ASSERT(minLod <= maxLod);
	return Vec2(minLod-lodErr, maxLod+lodErr);
}